

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int outputDpcmToFile(string *in_file_path,uchar *dpcm,int dpcmFrames,int dpcm_initial_volume)

{
  byte bVar1;
  _Ios_Openmode _Var2;
  ostream *poVar3;
  bool bVar4;
  char local_278 [8];
  ofstream ofs;
  __cxx11 local_78 [48];
  string local_48 [8];
  string outfname;
  int dpcm_initial_volume_local;
  int dpcmFrames_local;
  uchar *dpcm_local;
  string *in_file_path_local;
  
  std::__cxx11::string::string(local_48);
  getFileNameDeletingExt(in_file_path,(string *)local_48);
  std::__cxx11::string::operator+=(local_48,"_i");
  std::__cxx11::to_string(local_78,dpcm_initial_volume);
  std::__cxx11::string::operator+=(local_48,(string *)local_78);
  std::__cxx11::string::~string((string *)local_78);
  std::__cxx11::string::operator+=(local_48,".dmc");
  poVar3 = std::operator<<((ostream *)&std::cout,"output dmc file: ");
  poVar3 = std::operator<<(poVar3,local_48);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  _Var2 = std::operator|(_S_out,_S_bin);
  _Var2 = std::operator|(_Var2,_S_trunc);
  std::ofstream::ofstream(local_278,local_48,_Var2);
  bVar1 = std::ios::bad();
  bVar4 = (bVar1 & 1) != 0;
  if (bVar4) {
    poVar3 = std::operator<<((ostream *)&std::cout,"can not open file: ");
    poVar3 = std::operator<<(poVar3,local_48);
    std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  }
  else {
    std::ostream::write(local_278,(long)dpcm);
  }
  in_file_path_local._4_4_ = (uint)bVar4;
  std::ofstream::~ofstream(local_278);
  std::__cxx11::string::~string(local_48);
  return in_file_path_local._4_4_;
}

Assistant:

int outputDpcmToFile(const std::string &in_file_path, const unsigned char *dpcm, int dpcmFrames, int dpcm_initial_volume)
{
	std::string outfname;
	getFileNameDeletingExt(in_file_path, outfname);
	outfname += "_i";
	outfname += std::to_string(dpcm_initial_volume);
	outfname += ".dmc";
	std::cout << "output dmc file: " << outfname << std::endl;
	
	std::ofstream ofs(outfname, std::ios::out|std::ios::binary|std::ios::trunc);
	if (!ofs.bad()) {
		ofs.write((char*)dpcm, dpcmFrames/8);
	}
	else {
		std::cout << "can not open file: " << outfname << std::endl;
		return 1;
	}
	return 0;
}